

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
* __thiscall
capnproto_test::capnp::test::TestExtends::Client::graultRequest
          (Request<capnproto_test::capnp::test::TestExtends::GraultParams,_capnproto_test::capnp::test::TestAllTypes>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestExtends::GraultParams,capnproto_test::capnp::test::TestAllTypes>
            (__return_storage_ptr__,(Client *)(this + *(long *)(*(long *)this + -0x18)),
             0xe4e9bac98670b748,2,&local_20);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestExtends::GraultParams,  ::capnproto_test::capnp::test::TestAllTypes>
TestExtends::Client::graultRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestExtends::GraultParams,  ::capnproto_test::capnp::test::TestAllTypes>(
      0xe4e9bac98670b748ull, 2, sizeHint);
}